

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void initialize_impute_calc<ImputedData<unsigned_long,double>,PredictionData<double,unsigned_long>>
               (ImputedData<unsigned_long,_double> *imp,
               PredictionData<double,_unsigned_long> *prediction_data,Imputer *imputer,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t *psVar2;
  double *pdVar3;
  pointer puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  int *piVar7;
  pointer pvVar8;
  pointer pdVar9;
  value_type_conflict in_RAX;
  ulong uVar10;
  size_t sVar11;
  unsigned_long uVar12;
  pointer pdVar13;
  vector<double,_std::allocator<double>_> *this;
  long lVar14;
  size_t __n;
  size_t col;
  size_t sVar15;
  value_type_conflict local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  local_38 = in_RAX;
  if (prediction_data->numeric_data == (double *)0x0) {
    if (prediction_data->Xr != (double *)0x0) {
      if ((imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&imp->missing_sp,imputer->ncols_numeric);
      }
      puVar5 = prediction_data->Xr_indptr;
      uVar10 = puVar5[row];
      uVar12 = puVar5[row + 1];
      if (uVar10 < uVar12) {
        pdVar3 = prediction_data->Xr;
        puVar6 = prediction_data->Xr_ind;
        puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (0x7fefffffffffffff < (ulong)ABS(pdVar3[uVar10])) {
            uVar12 = puVar6[uVar10];
            sVar11 = imp->n_missing_sp;
            imp->n_missing_sp = sVar11 + 1;
            puVar4[sVar11] = uVar12;
            uVar12 = puVar5[row + 1];
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar12);
      }
      pdVar13 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar13) {
        if (imp->n_missing_sp == 0) goto LAB_002505ed;
        __n = imp->n_missing_sp << 3;
        memset(pdVar13,0,__n);
        pdVar13 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_0025059c;
      }
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->sp_num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->sp_num_weight;
      goto LAB_002505de;
    }
  }
  else {
    pvVar1 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_numeric);
    }
    psVar2 = &imp->n_missing_num;
    sVar11 = imputer->ncols_numeric;
    if (prediction_data->is_col_major == false) {
      if (sVar11 == 0) goto LAB_00250577;
      pdVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        if (0x7fefffffffffffff <
            (*(ulong *)((long)pdVar3 + uVar12 * 8 + row * 8 * sVar11) & 0x7fffffffffffffff)) {
          sVar11 = *psVar2;
          *psVar2 = sVar11 + 1;
          puVar4[sVar11] = uVar12;
          sVar11 = imputer->ncols_numeric;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < sVar11);
    }
    else if (sVar11 == 0) {
LAB_00250577:
      sVar11 = 0;
    }
    else {
      pdVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar3[row + prediction_data->nrows * uVar12])) {
          sVar11 = *psVar2;
          *psVar2 = sVar11 + 1;
          puVar4[sVar11] = uVar12;
          sVar11 = imputer->ncols_numeric;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < sVar11);
    }
    pdVar13 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar13) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(&imp->num_sum,sVar11,&local_38);
      this = &imp->num_weight;
LAB_002505de:
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_38);
    }
    else if (*psVar2 != 0) {
      __n = *psVar2 << 3;
      memset(pdVar13,0,__n);
      pdVar13 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_0025059c:
      memset(pdVar13,0,__n);
    }
  }
LAB_002505ed:
  if (prediction_data->categ_data == (int *)0x0) {
    return;
  }
  pvVar1 = &imp->missing_cat;
  if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imputer->ncols_categ);
  }
  sVar11 = imputer->ncols_categ;
  if (prediction_data->is_col_major == false) {
    if (sVar11 != 0) {
      piVar7 = prediction_data->categ_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        if (*(int *)((long)piVar7 + uVar10 * 4 + row * 4 * sVar11) < 0) {
          sVar11 = imp->n_missing_cat;
          imp->n_missing_cat = sVar11 + 1;
          puVar4[sVar11] = uVar10;
          sVar11 = imputer->ncols_categ;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < sVar11);
      goto LAB_002506be;
    }
  }
  else if (sVar11 != 0) {
    piVar7 = prediction_data->categ_data;
    puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      if (piVar7[row + prediction_data->nrows * uVar10] < 0) {
        sVar11 = imp->n_missing_cat;
        imp->n_missing_cat = sVar11 + 1;
        puVar4[sVar11] = uVar10;
        sVar11 = imputer->ncols_categ;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < sVar11);
    goto LAB_002506be;
  }
  sVar11 = 0;
LAB_002506be:
  pdVar13 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish == pdVar13) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(&imp->cat_weight,sVar11,&local_38);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&imp->cat_sum,imputer->ncols_categ);
    if (imputer->ncols_categ != 0) {
      lVar14 = 0;
      uVar10 = 0;
      do {
        local_38 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((imp->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar14),
                   (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10],&local_38);
        uVar10 = uVar10 + 1;
        lVar14 = lVar14 + 0x18;
      } while (uVar10 < imputer->ncols_categ);
    }
  }
  else {
    sVar11 = imp->n_missing_cat;
    if (sVar11 != 0) {
      sVar15 = 0;
      memset(pdVar13,0,sVar11 * 8);
      pvVar8 = (imp->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        uVar12 = puVar4[sVar15];
        pdVar13 = pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 = *(pointer *)
                  ((long)&pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8);
        if (pdVar13 != pdVar9) {
          memset(pdVar13,0,((long)pdVar9 + (-8 - (long)pdVar13) & 0xfffffffffffffff8U) + 8);
        }
        sVar15 = sVar15 + 1;
      } while (sVar11 != sVar15);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}